

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

void __thiscall
helics::NetworkCommsInterface::loadNetworkInfo
          (NetworkCommsInterface *this,NetworkBrokerData *netInfo)

{
  string *this_00;
  string *networkAddress;
  bool bVar1;
  ostream *poVar2;
  string bTarget;
  string local_48;
  
  CommsInterface::loadNetworkInfo(&this->super_CommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
  if (!bVar1) {
    return;
  }
  this->brokerPort = netInfo->brokerPort;
  LOCK();
  (this->PortNumber).super___atomic_base<int>._M_i = netInfo->portNumber;
  UNLOCK();
  this->maxRetries = netInfo->maxRetries;
  if (this->networkType < IP) {
    gmlc::networking::removeProtocol(&(this->super_CommsInterface).brokerTargetAddress);
    gmlc::networking::removeProtocol(&(this->super_CommsInterface).localTargetAddress);
  }
  if ((this->super_CommsInterface).localTargetAddress._M_string_length != 0) goto LAB_00267eb5;
  this_00 = &(this->super_CommsInterface).localTargetAddress;
  networkAddress = &(this->super_CommsInterface).brokerTargetAddress;
  gmlc::networking::stripProtocol(&bTarget,networkAddress);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &bTarget,"localhost");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bTarget,"127.0.0.1"), bVar1)) {
LAB_00267e9e:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               "localhost");
  }
  else if (bTarget._M_string_length == 0) {
    if ((this->super_CommsInterface).interfaceNetwork == LOCAL) goto LAB_00267e9e;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,1,'*');
  }
  else {
    gmlc::networking::generateMatchingInterfaceAddress
              (&local_48,networkAddress,(this->super_CommsInterface).interfaceNetwork);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&bTarget);
LAB_00267eb5:
  if (0 < netInfo->portStart) {
    (this->openPorts).startingPort = netInfo->portStart;
  }
  if ((this->super_CommsInterface).mRequireBrokerConnection == true) {
    if ((this->brokerPort < 0) && (-1 < netInfo->connectionPort)) {
      this->brokerPort = netInfo->connectionPort;
    }
  }
  else if (((this->PortNumber).super___atomic_base<int>._M_i < 0) && (-1 < netInfo->connectionPort))
  {
    LOCK();
    (this->PortNumber).super___atomic_base<int>._M_i = netInfo->connectionPort;
    UNLOCK();
  }
  if (0 < (this->PortNumber).super___atomic_base<int>._M_i) {
    this->autoPortNumber = false;
  }
  this->useOsPortAllocation = netInfo->use_os_port;
  this->appendNameToAddress = netInfo->appendNameToAddress;
  this->noAckConnection = netInfo->noAckConnection;
  (this->super_CommsInterface).useJsonSerialization = netInfo->useJsonSerialization;
  bVar1 = netInfo->encrypted;
  this->encrypted = bVar1;
  this->forceConnection = netInfo->forceConnection;
  if (bVar1 == true) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "encryption not enabled in HELICS, recompile with encryption enabled if required"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  CommsInterface::propertyUnLock(&this->super_CommsInterface);
  return;
}

Assistant:

void NetworkCommsInterface::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    using gmlc::networking::InterfaceTypes;
    using gmlc::networking::removeProtocol;

    CommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    brokerPort = netInfo.brokerPort;
    PortNumber = netInfo.portNumber;
    maxRetries = netInfo.maxRetries;
    switch (networkType) {
        case InterfaceTypes::TCP:
        case InterfaceTypes::UDP:
            removeProtocol(brokerTargetAddress);
            removeProtocol(localTargetAddress);
            break;
        default:
            break;
    }
    if (localTargetAddress.empty()) {
        auto bTarget = gmlc::networking::stripProtocol(brokerTargetAddress);
        if ((bTarget == localHostString) || (bTarget == "127.0.0.1")) {
            localTargetAddress = localHostString;
        } else if (bTarget.empty()) {
            switch (interfaceNetwork) {
                case gmlc::networking::InterfaceNetworks::LOCAL:
                    localTargetAddress = localHostString;
                    break;
                default:
                    localTargetAddress.assign(1, '*');
                    break;
            }
        } else {
            localTargetAddress =
                generateMatchingInterfaceAddress(brokerTargetAddress, interfaceNetwork);
        }
    }

    if (netInfo.portStart > 0) {
        openPorts.setStartingPortNumber(netInfo.portStart);
    }

    if (mRequireBrokerConnection) {
        if (brokerPort < 0 && netInfo.connectionPort >= 0) {
            brokerPort = netInfo.connectionPort;
        }
    } else {
        if (PortNumber < 0 && netInfo.connectionPort >= 0) {
            PortNumber = netInfo.connectionPort;
        }
    }

    if (PortNumber > 0) {
        autoPortNumber = false;
    }
    useOsPortAllocation = netInfo.use_os_port;
    appendNameToAddress = netInfo.appendNameToAddress;
    noAckConnection = netInfo.noAckConnection;
    useJsonSerialization = netInfo.useJsonSerialization;
    encrypted = netInfo.encrypted;
    forceConnection = netInfo.forceConnection;
#ifndef HELICS_ENABLE_ENCRYPTION
    if (encrypted) {
        std::cerr
            << "encryption not enabled in HELICS, recompile with encryption enabled if required"
            << std::endl;
    }
#endif
    propertyUnLock();
}